

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O0

Constraint * create_constraint(void)

{
  Constraint *pCVar1;
  Constraint *constraint;
  
  pCVar1 = (Constraint *)malloc(0x80);
  pCVar1->parameter_name = (char *)0x0;
  pCVar1->destroy = destroy_empty_constraint;
  pCVar1->failure_message = failure_message_for;
  pCVar1->expected_value_name = (char *)0x0;
  pCVar1->actual_value_message = default_actual_value_message;
  pCVar1->expected_value_message = default_expected_value_message;
  return pCVar1;
}

Assistant:

Constraint *create_constraint(void) {
    Constraint *constraint = (Constraint *)malloc(sizeof(Constraint));
    /* TODO: setting this to NULL as an implicit type check :( */
    constraint->parameter_name = NULL;
    constraint->destroy = &destroy_empty_constraint;
    constraint->failure_message = &failure_message_for;
    constraint->expected_value_name = NULL;
    constraint->actual_value_message = default_actual_value_message;
    constraint->expected_value_message = default_expected_value_message;

    return constraint;
}